

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O2

int __thiscall gl3cts::TextureSizePromotion::Tests::init(Tests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  FunctionalTest *this_00;
  
  this_00 = (FunctionalTest *)operator_new(0x90);
  TextureSizePromotion::FunctionalTest::FunctionalTest
            (this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  return extraout_EAX;
}

Assistant:

void Tests::init(void)
{
	addChild(new TextureSizePromotion::FunctionalTest(m_context));
}